

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
SGParser::Parse<SGParser::ParseStackGenericElement>::CleanupParseStack
          (Parse<SGParser::ParseStackGenericElement> *this,size_t tillPos)

{
  ulong local_20;
  size_t i;
  size_t tillPos_local;
  Parse<SGParser::ParseStackGenericElement> *this_local;
  
  for (local_20 = this->StackPosition; tillPos < local_20; local_20 = local_20 - 1) {
    if (this->pStack[local_20].super_ParseStackElement<SGParser::GenericToken>.TerminalMarker !=
        0xffffffffffffffff) {
      BacktrackingTokenStream<SGParser::GenericToken>::ReleaseMarker
                (&this->Stream,
                 this->pStack[local_20].super_ParseStackElement<SGParser::GenericToken>.
                 TerminalMarker);
    }
    ParseStackElement<SGParser::GenericToken>::Cleanup
              (&this->pStack[local_20].super_ParseStackElement<SGParser::GenericToken>);
  }
  this->StackPosition = tillPos;
  return;
}

Assistant:

void Parse<StackElement>::CleanupParseStack(size_t tillPos) {
    // Call the destroy function for all stack elements (except 0 - special element)
    for (auto i = StackPosition; i > tillPos; --i) {
        if (pStack[i].TerminalMarker != InvalidIndex)
            Stream.ReleaseMarker(pStack[i].TerminalMarker);
        pStack[i].Cleanup();
    }
    // And reset position to last 'valid' element - usually 0
    StackPosition = tillPos;
}